

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaCof.c
# Opt level: O1

Gia_Man_t * Gia_ManDupCofInt(Gia_Man_t *p,int iVar)

{
  int iVar1;
  int iVar2;
  char *pcVar3;
  ulong uVar4;
  Gia_Obj_t *pGVar5;
  int *piVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  uint uVar10;
  Gia_Man_t *p_00;
  size_t sVar11;
  char *pcVar12;
  Gia_Obj_t *pGVar13;
  Gia_Obj_t *pGVar14;
  Vec_Int_t *pVVar15;
  uint uVar16;
  undefined4 in_register_00000034;
  long lVar17;
  long lVar18;
  Gia_Obj_t *pGVar19;
  
  if ((iVar < 1) || (p->nObjs <= iVar)) {
    p_00 = (Gia_Man_t *)0x0;
    printf("Gia_ManDupCof(): Variable %d is out of range (%d; %d).\n",
           CONCAT44(in_register_00000034,iVar),0,(ulong)(uint)p->nObjs);
  }
  else {
    pGVar13 = p->pObjs;
    uVar16 = *(uint *)(pGVar13 + (uint)iVar);
    if (((uVar16 & 0x9fffffff) == 0x9fffffff) || (-1 < (int)uVar16 && (~uVar16 & 0x1fffffff) != 0))
    {
      p_00 = Gia_ManStart(p->nObjs);
      pcVar3 = p->pName;
      if (pcVar3 == (char *)0x0) {
        pcVar12 = (char *)0x0;
      }
      else {
        sVar11 = strlen(pcVar3);
        pcVar12 = (char *)malloc(sVar11 + 1);
        strcpy(pcVar12,pcVar3);
      }
      p_00->pName = pcVar12;
      pcVar3 = p->pSpec;
      if (pcVar3 == (char *)0x0) {
        pcVar12 = (char *)0x0;
      }
      else {
        sVar11 = strlen(pcVar3);
        pcVar12 = (char *)malloc(sVar11 + 1);
        strcpy(pcVar12,pcVar3);
      }
      pGVar13 = pGVar13 + (uint)iVar;
      p_00->pSpec = pcVar12;
      Gia_ManHashAlloc(p_00);
      Gia_ManFillValue(p);
      p->pObjs->Value = 0;
      pVVar15 = p->vCis;
      if (pVVar15->nSize < 1) {
        uVar16 = 0xffffffff;
      }
      else {
        uVar16 = 0xffffffff;
        lVar18 = 0;
        do {
          iVar9 = pVVar15->pArray[lVar18];
          if (((long)iVar9 < 0) || (p->nObjs <= iVar9)) goto LAB_0070d903;
          pGVar19 = p->pObjs;
          if (pGVar19 == (Gia_Obj_t *)0x0) break;
          pGVar14 = Gia_ManAppendObj(p_00);
          uVar4 = *(ulong *)pGVar14;
          *(ulong *)pGVar14 = uVar4 | 0x9fffffff;
          *(ulong *)pGVar14 =
               uVar4 & 0xe0000000ffffffff | 0x9fffffff |
               (ulong)(p_00->vCis->nSize & 0x1fffffff) << 0x20;
          pGVar5 = p_00->pObjs;
          if ((pGVar14 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar14)) {
LAB_0070d922:
            __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
          }
          Vec_IntPush(p_00->vCis,(int)((ulong)((long)pGVar14 - (long)pGVar5) >> 2) * -0x55555555);
          pGVar5 = p_00->pObjs;
          if ((pGVar14 < pGVar5) || (pGVar5 + p_00->nObjs <= pGVar14)) goto LAB_0070d922;
          pGVar19 = pGVar19 + iVar9;
          uVar7 = (int)((ulong)((long)pGVar14 - (long)pGVar5) >> 2) * 0x55555556;
          uVar10 = uVar7;
          if (pGVar19 == pGVar13) {
            uVar10 = 0;
            uVar16 = uVar7;
          }
          pGVar19->Value = uVar10;
          lVar18 = lVar18 + 1;
          pVVar15 = p->vCis;
        } while (lVar18 < pVVar15->nSize);
      }
      iVar9 = p->nObjs;
      if ((0 < iVar9) && (pGVar19 = p->pObjs, pGVar19 != (Gia_Obj_t *)0x0)) {
        lVar18 = 0;
        uVar10 = uVar16;
        do {
          uVar4 = *(ulong *)pGVar19;
          if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
            if ((int)pGVar19[-(uVar4 & 0x1fffffff)].Value < 0) goto LAB_0070d941;
            uVar16 = (uint)(uVar4 >> 0x20);
            if ((int)pGVar19[-(ulong)(uVar16 & 0x1fffffff)].Value < 0) goto LAB_0070d941;
            uVar8 = Gia_ManHashAnd(p_00,pGVar19[-(uVar4 & 0x1fffffff)].Value ^
                                        (uint)(uVar4 >> 0x1d) & 1,
                                   pGVar19[-(ulong)(uVar16 & 0x1fffffff)].Value ^ uVar16 >> 0x1d & 1
                                  );
            uVar7 = uVar8;
            uVar16 = uVar10;
            if (pGVar19 == pGVar13) {
              uVar7 = 0;
              uVar16 = uVar8;
            }
            pGVar19->Value = uVar7;
            uVar10 = uVar16;
          }
          lVar18 = lVar18 + 1;
          iVar9 = p->nObjs;
        } while ((lVar18 < iVar9) && (pGVar19 = p->pObjs + lVar18, p->pObjs != (Gia_Obj_t *)0x0));
      }
      lVar18 = (long)p->vCos->nSize;
      if (0 < lVar18) {
        piVar6 = p->vCos->pArray;
        lVar17 = 0;
        do {
          iVar1 = piVar6[lVar17];
          if (((long)iVar1 < 0) || (iVar9 <= iVar1)) goto LAB_0070d903;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          pGVar19 = p->pObjs + iVar1;
          if ((int)pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value < 0)
          goto LAB_0070d941;
          pGVar19->Value =
               (uint)*(undefined8 *)pGVar19 >> 0x1d & 1 ^
               pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value;
          lVar17 = lVar17 + 1;
        } while (lVar18 != lVar17);
      }
      pVVar15 = p->vCis;
      if (0 < pVVar15->nSize) {
        lVar18 = 0;
        do {
          iVar1 = pVVar15->pArray[lVar18];
          if (((long)iVar1 < 0) || (iVar9 <= iVar1)) goto LAB_0070d903;
          if (p->pObjs == (Gia_Obj_t *)0x0) break;
          if (p_00->vCis->nSize <= lVar18) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                          ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
          }
          iVar2 = p_00->vCis->pArray[lVar18];
          if ((iVar2 < 0) || (p_00->nObjs <= iVar2)) goto LAB_0070d903;
          pGVar19 = p->pObjs + iVar1;
          uVar10 = iVar2 * 2;
          if (pGVar19 == pGVar13) {
            uVar10 = 1;
          }
          pGVar19->Value = uVar10;
          lVar18 = lVar18 + 1;
          pVVar15 = p->vCis;
        } while (lVar18 < pVVar15->nSize);
      }
      if (0 < p->nObjs) {
        lVar17 = 0;
        lVar18 = 0;
        do {
          pGVar19 = p->pObjs;
          if (pGVar19 == (Gia_Obj_t *)0x0) break;
          uVar4 = *(ulong *)(&pGVar19->field_0x0 + lVar17);
          if ((uVar4 & 0x1fffffff) != 0x1fffffff && -1 < (int)uVar4) {
            uVar10 = *(uint *)((long)pGVar19 +
                              lVar17 + (ulong)(uint)((int)(uVar4 & 0x1fffffff) << 2) * -3 + 8);
            if (((int)uVar10 < 0) ||
               (uVar7 = *(uint *)((long)pGVar19 +
                                 lVar17 + (ulong)((uint)(uVar4 >> 0x1e) & 0x7ffffffc) * -3 + 8),
               (int)uVar7 < 0)) goto LAB_0070d941;
            iVar9 = Gia_ManHashAnd(p_00,uVar10 ^ (uint)(uVar4 >> 0x1d) & 1,
                                   uVar7 ^ (uint)(uVar4 >> 0x3d) & 1);
            if ((Gia_Obj_t *)(&pGVar19->field_0x0 + lVar17) == pGVar13) {
              iVar9 = 1;
            }
            *(int *)((long)&pGVar19->Value + lVar17) = iVar9;
          }
          lVar18 = lVar18 + 1;
          lVar17 = lVar17 + 0xc;
        } while (lVar18 < p->nObjs);
      }
      if ((int)uVar16 < 1) {
        __assert_fail("iCofVar > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaCof.c"
                      ,0x346,"Gia_Man_t *Gia_ManDupCofInt(Gia_Man_t *, int)");
      }
      pVVar15 = p->vCos;
      if (0 < pVVar15->nSize) {
        lVar18 = 0;
        do {
          lVar17 = (long)pVVar15->pArray[lVar18];
          if ((lVar17 < 0) || (p->nObjs <= pVVar15->pArray[lVar18])) {
LAB_0070d903:
            __assert_fail("v >= 0 && v < p->nObjs",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/gia.h"
                          ,0x1d1,"Gia_Obj_t *Gia_ManObj(Gia_Man_t *, int)");
          }
          pGVar13 = p->pObjs;
          if (pGVar13 == (Gia_Obj_t *)0x0) break;
          pGVar19 = pGVar13 + lVar17;
          if ((int)pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value < 0) {
LAB_0070d941:
            __assert_fail("Lit >= 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/abc_global.h"
                          ,0x132,"int Abc_LitNotCond(int, int)");
          }
          uVar10 = (uint)*(undefined8 *)pGVar19 >> 0x1d & 1 ^
                   pGVar19[-(ulong)((uint)*(undefined8 *)pGVar19 & 0x1fffffff)].Value;
          if (pGVar13[lVar17].Value != uVar10) {
            uVar10 = Gia_ManHashMux(p_00,uVar16,uVar10,pGVar13[lVar17].Value);
          }
          uVar10 = Gia_ManAppendCo(p_00,uVar10);
          pGVar19->Value = uVar10;
          lVar18 = lVar18 + 1;
          pVVar15 = p->vCos;
        } while (lVar18 < pVVar15->nSize);
      }
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,p->nRegs);
    }
    else {
      p_00 = (Gia_Man_t *)0x0;
      printf("Gia_ManDupCof(): Variable %d should be a CI or an AND node.\n");
    }
  }
  return p_00;
}

Assistant:

Gia_Man_t * Gia_ManDupCofInt( Gia_Man_t * p, int iVar )
{
    Gia_Man_t * pNew;
    Gia_Obj_t * pObj, * pPivot;
    int i, iCofVar = -1;
    if ( !(iVar > 0 && iVar < Gia_ManObjNum(p)) )
    {
        printf( "Gia_ManDupCof(): Variable %d is out of range (%d; %d).\n", iVar, 0, Gia_ManObjNum(p) );
        return NULL;
    }
    // find the cofactoring variable
    pPivot = Gia_ManObj( p, iVar );
    if ( !Gia_ObjIsCand(pPivot) )
    {
        printf( "Gia_ManDupCof(): Variable %d should be a CI or an AND node.\n", iVar );
        return NULL;
    }
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    Gia_ManHashAlloc( pNew );
    Gia_ManFillValue( p );
    Gia_ManConst0(p)->Value = 0;
    // compute negative cofactor
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Gia_ManAppendCi(pNew);
        if ( pObj == pPivot )
        {
            iCofVar = pObj->Value;
            pObj->Value = Abc_Var2Lit( 0, 0 );
        }
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( pObj == pPivot )
        {
            iCofVar = pObj->Value;
            pObj->Value = Abc_Var2Lit( 0, 0 );
        }
    }
    Gia_ManForEachCo( p, pObj, i )
        pObj->Value = Gia_ObjFanin0Copy(pObj);
    // compute the positive cofactor
    Gia_ManForEachCi( p, pObj, i )
    {
        pObj->Value = Abc_Var2Lit( Gia_ObjId(pNew, Gia_ManCi(pNew, i)), 0 );
        if ( pObj == pPivot )
            pObj->Value = Abc_Var2Lit( 0, 1 );
    }
    Gia_ManForEachAnd( p, pObj, i )
    {
        pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        if ( pObj == pPivot )
            pObj->Value = Abc_Var2Lit( 0, 1 );
    }
    // create MUXes
    assert( iCofVar > 0 );
    Gia_ManForEachCo( p, pObj, i )
    {
        if ( pObj->Value == (unsigned)Gia_ObjFanin0Copy(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ManHashMux(pNew, iCofVar, Gia_ObjFanin0Copy(pObj), pObj->Value) );
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    return pNew;
}